

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O2

void __thiscall
ConvertorPCM2WAV::ConvertorPCM2WAV
          (ConvertorPCM2WAV *this,PBuffer *_buffer,size_t _chenals,size_t _rate)

{
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  Convertor::Convertor(&this->super_Convertor,(PBuffer *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__ConvertorPCM2WAV_00152be8;
  (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->chenals = _chenals;
  this->rate = _rate;
  return;
}

Assistant:

ConvertorPCM2WAV::ConvertorPCM2WAV(PBuffer _buffer,
                                   size_t _chenals,
                                   size_t _rate)
  : Convertor(_buffer)
  , chenals(_chenals)
  , rate(_rate) {
}